

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

void If_CutPrint(If_Cut_t *pCut)

{
  char *pcVar1;
  ulong uVar2;
  
  Abc_Print(1,"{");
  for (uVar2 = 0; uVar2 < (byte)pCut->field_0x1f; uVar2 = uVar2 + 1) {
    pcVar1 = "!";
    if (((uint)pCut->uMaskFunc >> ((uint)uVar2 & 0x1f) & 1) == 0) {
      pcVar1 = "";
    }
    Abc_Print(1," %s%d",pcVar1,(ulong)(uint)(&pCut[1].Area)[uVar2]);
  }
  Abc_Print(1," }\n");
  return;
}

Assistant:

void If_CutPrint( If_Cut_t * pCut )
{
    unsigned i;
    Abc_Print( 1, "{" );
    for ( i = 0; i < pCut->nLeaves; i++ )
        Abc_Print( 1, " %s%d", If_CutLeafBit(pCut, i) ? "!":"", pCut->pLeaves[i] );
    Abc_Print( 1, " }\n" );
}